

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O1

FT_Int tt_face_get_kerning(TT_Face face,FT_UInt left_glyph,FT_UInt right_glyph)

{
  uint uVar1;
  FT_Byte *pFVar2;
  ulong uVar3;
  uint uVar4;
  FT_Byte *base;
  FT_Byte *pFVar5;
  uint uVar6;
  long lVar7;
  FT_Byte *pFVar8;
  FT_UInt FVar9;
  FT_ULong key0;
  ulong uVar10;
  FT_Byte *pFVar11;
  uint *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  FT_Int FVar17;
  bool bVar18;
  
  pFVar5 = face->kern_table;
  FVar17 = 0;
  if (pFVar5 != (FT_Byte *)0x0) {
    FVar9 = face->num_kern_tables;
    FVar17 = 0;
    if (9 < (long)face->kern_table_size && FVar9 != 0) {
      pFVar8 = pFVar5 + face->kern_table_size;
      pFVar2 = pFVar5 + 10;
      uVar10 = (ulong)right_glyph | (ulong)left_glyph << 0x10;
      uVar6 = 1;
      FVar17 = 0;
      pFVar5 = pFVar5 + 4;
      do {
        pFVar11 = pFVar5 + (ushort)(*(ushort *)(pFVar5 + 2) << 8 | *(ushort *)(pFVar5 + 2) >> 8);
        if (pFVar8 < pFVar5 + (ushort)(*(ushort *)(pFVar5 + 2) << 8 | *(ushort *)(pFVar5 + 2) >> 8))
        {
          pFVar11 = pFVar8;
        }
        if (((face->kern_avail_bits & uVar6) != 0) && (pFVar5[4] == '\0')) {
          puVar12 = (uint *)(pFVar5 + 0xe);
          lVar7 = (long)pFVar11 - (long)puVar12;
          uVar4 = ((int)(lVar7 / 6) + (int)(lVar7 >> 0x3f)) -
                  (SUB164(SEXT816(lVar7) * SEXT816(0x2aaaaaaaaaaaaaab),0xc) >> 0x1f);
          if ((long)(ulong)((uint)CONCAT11(*pFVar2,pFVar5[7]) * 6) <= lVar7) {
            uVar4 = (uint)CONCAT11(*pFVar2,pFVar5[7]);
          }
          if ((face->kern_order_bits & uVar6) == 0) {
            uVar1 = 0;
            if (uVar4 == 0) {
              bVar18 = true;
            }
            else {
              do {
                uVar15 = *puVar12;
                if ((uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18) == uVar10) {
                  uVar1 = (int)(short)((ushort)(byte)puVar12[1] << 8) |
                          (uint)*(byte *)((long)puVar12 + 5);
                  iVar16 = 0xb;
                  goto LAB_0024994d;
                }
                puVar12 = (uint *)((long)puVar12 + 6);
                uVar4 = uVar4 - 1;
              } while (uVar4 != 0);
              iVar16 = 0;
LAB_0024994d:
              bVar18 = iVar16 == 0;
            }
            if (bVar18) goto LAB_00249973;
            bVar18 = false;
          }
          else {
            uVar1 = 0;
            uVar15 = 0;
            do {
              if (uVar4 <= uVar15) {
                iVar16 = 0;
                break;
              }
              uVar3 = (ulong)((uVar4 + uVar15 & 0xfffffffe) * 3);
              uVar14 = *(uint *)((long)puVar12 + uVar3);
              uVar13 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                              uVar14 << 0x18);
              if (uVar13 == uVar10) {
                uVar1 = (int)(short)((ushort)pFVar5[uVar3 + 0x12] << 8) | (uint)pFVar5[uVar3 + 0x13]
                ;
                iVar16 = 0xb;
              }
              else {
                uVar14 = uVar4 + uVar15 >> 1;
                if (uVar13 < uVar10) {
                  uVar15 = uVar14 + 1;
                  uVar14 = uVar4;
                }
                iVar16 = 0;
                uVar4 = uVar14;
              }
            } while (uVar13 != uVar10);
            if (iVar16 == 0) {
LAB_00249973:
              bVar18 = true;
            }
            else {
              bVar18 = false;
            }
          }
          if (!bVar18) {
            if ((pFVar5[5] & 8) != 0) {
              FVar17 = 0;
            }
            FVar17 = FVar17 + uVar1;
          }
        }
        FVar9 = FVar9 - 1;
        if (FVar9 == 0) {
          return FVar17;
        }
        uVar6 = uVar6 * 2;
        pFVar2 = pFVar11 + 6;
        pFVar5 = pFVar11;
      } while (pFVar2 <= pFVar8);
    }
  }
  return FVar17;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  tt_face_get_kerning( TT_Face  face,
                       FT_UInt  left_glyph,
                       FT_UInt  right_glyph )
  {
    FT_Int   result = 0;
    FT_UInt  count, mask;

    FT_Byte*  p;
    FT_Byte*  p_limit;


    if ( !face->kern_table )
      return result;

    p       = face->kern_table;
    p_limit = p + face->kern_table_size;

    p   += 4;
    mask = 0x0001;

    for ( count = face->num_kern_tables;
          count > 0 && p + 6 <= p_limit;
          count--, mask <<= 1 )
    {
      FT_Byte* base     = p;
      FT_Byte* next;
      FT_UInt  version  = FT_NEXT_USHORT( p );
      FT_UInt  length   = FT_NEXT_USHORT( p );
      FT_UInt  coverage = FT_NEXT_USHORT( p );
      FT_UInt  num_pairs;
      FT_Int   value    = 0;

      FT_UNUSED( version );


      next = base + length;

      if ( next > p_limit )  /* handle broken table */
        next = p_limit;

      if ( ( face->kern_avail_bits & mask ) == 0 )
        goto NextTable;

      FT_ASSERT( p + 8 <= next ); /* tested in tt_face_load_kern */

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( next - p ) < 6 * (int)num_pairs )  /* handle broken count  */
        num_pairs = (FT_UInt)( ( next - p ) / 6 );

      switch ( coverage >> 8 )
      {
      case 0:
        {
          FT_ULong  key0 = TT_KERN_INDEX( left_glyph, right_glyph );


          if ( face->kern_order_bits & mask )   /* binary search */
          {
            FT_UInt   min = 0;
            FT_UInt   max = num_pairs;


            while ( min < max )
            {
              FT_UInt   mid = ( min + max ) >> 1;
              FT_Byte*  q   = p + 6 * mid;
              FT_ULong  key;


              key = FT_NEXT_ULONG( q );

              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( q );
                goto Found;
              }
              if ( key < key0 )
                min = mid + 1;
              else
                max = mid;
            }
          }
          else /* linear search */
          {
            FT_UInt  count2;


            for ( count2 = num_pairs; count2 > 0; count2-- )
            {
              FT_ULong  key = FT_NEXT_ULONG( p );


              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( p );
                goto Found;
              }
              p += 2;
            }
          }
        }
        break;

       /*
        * We don't support format 2 because we haven't seen a single font
        * using it in real life...
        */

      default:
        ;
      }

      goto NextTable;

    Found:
      if ( coverage & 8 ) /* override or add */
        result = value;
      else
        result += value;

    NextTable:
      p = next;
    }

    return result;
  }